

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

void __thiscall BoxNesting::Box::Box(Box *this,array<float,_3UL> *sideLengths)

{
  long lVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  this->_vptr_Box = (_func_int **)&PTR__Box_0011fa40;
  *(undefined8 *)(this->sideLengths)._M_elems = *(undefined8 *)sideLengths->_M_elems;
  (this->sideLengths)._M_elems[2] = sideLengths->_M_elems[2];
  std::__insertion_sort<float*,__gnu_cxx::__ops::_Iter_less_iter>
            (&this->sideLengths,&this->field_0x14);
  lVar1 = -0xc;
  while ((0.5 < *(float *)((long)(&this->sideLengths + 1) + lVar1) &&
         (*(float *)((long)(&this->sideLengths + 1) + lVar1) < 1.0))) {
    lVar1 = lVar1 + 4;
    if (lVar1 == 0) {
      return;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Length of a side of a box is not between allowed range: (",0x39);
  poVar2 = std::ostream::_M_insert<double>(0.5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Box::Box(const std::array<float, 3>& sideLengths) : sideLengths(sideLengths)
{
	// Sice we only care whether a box can nest inside another box
	// We can optimize this check by always just sorting the lengths
	// so we don't have to check the permutations of the sidelengths
	std::sort(this->sideLengths.begin(), this->sideLengths.end());

	for (auto l : this->sideLengths) {
		if (l <= Box::minLength || l >= Box::maxLength) {
			std::stringstream ss;
			ss << "Length of a side of a box is not between allowed range: (" << Box::minLength << "," << Box::maxLength
			   << ")";
			throw std::invalid_argument(ss.str());
		}
	}
}